

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<Edge> * __thiscall vector<Edge>::operator=(vector<Edge> *this,vector<Edge> *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  Edge *pEVar5;
  ulong uVar6;
  Edge *local_50;
  int local_28 [2];
  int i;
  vector<Edge> *local_18;
  vector<Edge> *other_local;
  vector<Edge> *this_local;
  
  this->_size = other->_size;
  this->_capacity = other->_capacity;
  uVar2 = (ulong)this->_capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  local_18 = other;
  other_local = this;
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pEVar5 = (Edge *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_50 = pEVar5;
    do {
      Edge::Edge(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pEVar5 + uVar2);
  }
  this->vect = pEVar5;
  for (local_28[0] = 0; local_28[0] < this->_size; local_28[0] = local_28[0] + 1) {
    pEVar5 = operator[](local_18,local_28);
    Edge::operator=(this->vect + local_28[0],pEVar5);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }